

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O2

type LBFGS(Mesh *mesh,VectorXd *x,double *error)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  ResScalar RVar4;
  ResScalar RVar5;
  RealScalar RVar6;
  VectorXd VVar7;
  Mesh *pMVar8;
  bool bVar9;
  ostream *poVar10;
  uint __val;
  double *in_RCX;
  ulong uVar11;
  int iVar12;
  Index extraout_RDX;
  ulong uVar13;
  ulong uVar14;
  int i;
  uint uVar15;
  long lVar16;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pMVar17;
  uint uVar18;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> PVar19;
  type tVar20;
  undefined1 auVar21 [12];
  VertexHandle handles [10];
  long local_488;
  VectorXd r;
  Options local_454;
  VectorXd gradx;
  long local_438;
  long local_430;
  VectorXd *local_428;
  VectorXd q;
  CirculatorRange<OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>,_OpenMesh::FaceHandle,_&OpenMesh::PolyConnectivity::cfv_begin,_&OpenMesh::PolyConnectivity::cfv_end>
  local_400;
  Mesh *local_3f0;
  double *local_3e8;
  double epsilon;
  VectorXd ss [7];
  VectorXd gradx0;
  VectorXd ys [7];
  double rhos [7];
  double alphas [7];
  Mesh omesh;
  
  ss[6].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  ss[6].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  ss[5].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  ss[5].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  ss[4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  ss[4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  ss[3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  ss[3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  ss[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  ss[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  ss[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  ss[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  ss[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  ss[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  ys[6].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  ys[6].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  ys[5].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  ys[5].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  ys[4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  ys[4].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  ys[3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  ys[3].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  ys[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  ys[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  ys[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  ys[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  ys[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  ys[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_3e8 = in_RCX;
  dVar3 = getAveLen((Mesh *)x,(VectorXd *)error);
  dVar3 = dVar3 * 0.25;
  local_3f0 = mesh;
  epsilon = dVar3;
  calcGrad((Mesh *)&gradx,x,dVar3);
  uVar11 = 0;
  do {
    __val = (uint)uVar11;
    uVar15 = 7;
    if (7 < (int)__val) {
      uVar15 = __val;
    }
    OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>::PolyMesh_ArrayKernelT(&omesh);
    uVar13 = (ulong)(uVar15 - 7);
    local_488 = uVar13 * 8;
    local_430 = uVar13 * 0x10;
    local_428 = ys + uVar13;
    local_438 = local_430 + 8;
    for (lVar16 = 0; lVar16 < (long)error[1]; lVar16 = lVar16 + 2) {
      pdVar1 = (double *)((long)*error + lVar16 * 8);
      handles[1].super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)(float)pdVar1[1];
      handles[0].super_BaseHandle.idx_ = (BaseHandle)(BaseHandle)(float)*pdVar1;
      handles._8_8_ = handles._8_8_ & 0xffffffff00000000;
      OpenMesh::
      PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>_>
      ::new_vertex(&omesh.super_Mesh,(Point *)handles);
    }
    PVar19.m_storage =
         (DenseStorage<double,__1,__1,_1,_0>)
         OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)x);
    r.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage =
         (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)
         (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>)PVar19.m_storage;
    auVar21 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)x);
    while( true ) {
      if (auVar21 ==
          r.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage._0_12_) break;
      handles[4].super_BaseHandle.idx_ = (BaseHandle)-1;
      handles[5].super_BaseHandle.idx_ = (BaseHandle)-1;
      handles[6].super_BaseHandle.idx_ = (BaseHandle)0xffffffff;
      handles[7].super_BaseHandle.idx_ = (BaseHandle)0xffffffff;
      handles[0].super_BaseHandle.idx_ = (BaseHandle)0xffffffff;
      handles[1].super_BaseHandle.idx_ = (BaseHandle)0xffffffff;
      handles[2].super_BaseHandle.idx_ = (BaseHandle)0xffffffff;
      handles[3].super_BaseHandle.idx_ = (BaseHandle)0xffffffff;
      handles[8].super_BaseHandle.idx_ = (BaseHandle)0xffffffff;
      handles[9].super_BaseHandle.idx_ = (BaseHandle)0xffffffff;
      local_400.center_.super_BaseHandle.idx_ =
           (BaseHandle)
           (BaseHandle)
           r.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_;
      q.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_ =
           *(uint *)(x[0xf].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                     .m_rows +
                    (long)r.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_rows._0_4_ * 4);
      q.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
           (double *)x;
      q.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
           q.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_;
      local_400.container_ = (PolyConnectivity *)x;
      OpenMesh::PolyConnectivity::
      CirculatorRange<OpenMesh::PolyConnectivity,_OpenMesh::Iterators::GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>,_OpenMesh::FaceHandle,_&OpenMesh::PolyConnectivity::cfv_begin,_&OpenMesh::PolyConnectivity::cfv_end>
      ::end((GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
             *)&gradx0,&local_400);
      uVar14 = 0;
      while( true ) {
        bVar9 = OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::operator!=
                          ((GenericCirculatorBaseT<OpenMesh::PolyConnectivity> *)&q,
                           (GenericCirculatorBaseT<OpenMesh::PolyConnectivity> *)&gradx0);
        if (!bVar9) break;
        handles[uVar14].super_BaseHandle.idx_ =
             *(int *)((ulong)((q.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                               m_storage.m_rows._4_4_ & 1U) << 4) + 4 +
                     (long)(q.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                            m_storage.m_rows._4_4_ >> 1) * 0x20 +
                     (long)q.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_data[0x1c]);
        uVar14 = uVar14 + 1;
        OpenMesh::Iterators::
        GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
        ::operator++((GenericCirculatorT_DEPRECATED<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                      *)&q);
      }
      OpenMesh::PolyConnectivity::add_face((PolyConnectivity *)&omesh,handles,uVar14 & 0xffffffff);
      OpenMesh::Iterators::
      GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
      ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                    *)&r);
    }
    if ((__val == 1) || ((int)(uVar11 % 10) == 0)) {
      std::__cxx11::to_string((string *)&r,__val);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gradx0,
                     (string *)&r,"test");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&q,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gradx0,
                     "_param");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)handles,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&q,".obj")
      ;
      local_454.flags_ = 0;
      OpenMesh::IO::write_mesh<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>>
                (&omesh,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)handles
                 ,&local_454,6);
      std::__cxx11::string::~string((string *)handles);
      std::__cxx11::string::~string((string *)&q);
      std::__cxx11::string::~string((string *)&gradx0);
      std::__cxx11::string::~string((string *)&r);
    }
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)&q,(DenseStorage<double,__1,__1,_1,_0> *)&gradx
              );
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)&gradx0,
               (DenseStorage<double,__1,__1,_1,_0> *)&gradx);
    handles._0_8_ = error[1];
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&r,(long *)handles);
    uVar15 = 7;
    if (7 < (int)__val) {
      uVar15 = __val;
    }
    for (uVar18 = __val - 1; uVar14 = (ulong)uVar18 % 7, (int)(uVar15 - 7) <= (int)uVar18;
        uVar18 = uVar18 - 1) {
      RVar4 = Eigen::internal::
              dot_nocheck<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>
              ::run((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&q,
                    (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(ss + uVar14));
      handles._24_8_ = RVar4 * rhos[uVar14];
      alphas[uVar14] = (double)handles._24_8_;
      handles._32_8_ = ys + uVar14;
      handles._8_8_ =
           ys[uVar14].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-=
                ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&q,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)handles);
    }
    if (__val == 0) {
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
                (&r,(Matrix<double,__1,_1,_0,__1,_1> *)&q);
    }
    else {
      iVar12 = (int)(__val - 1) % 7;
      pMVar17 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(ys + iVar12);
      RVar4 = Eigen::internal::
              dot_nocheck<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>
              ::run((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(ss + iVar12),pMVar17);
      RVar5 = Eigen::internal::
              dot_nocheck<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>
              ::run(pMVar17,pMVar17);
      handles._24_8_ = RVar4 / RVar5;
      handles[3].super_BaseHandle.idx_ =
           (BaseHandle)
           (BaseHandle)
           q.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_;
      handles[2].super_BaseHandle.idx_ =
           (BaseHandle)
           (BaseHandle)
           q.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_;
      handles._32_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&q;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                (&r,(CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                     *)handles);
    }
    for (; uVar14 = uVar13 / 7, (uint)uVar13 < __val; uVar13 = uVar13 + 1) {
      lVar16 = local_488 + uVar14 * -0x38;
      dVar2 = *(double *)((long)rhos + lVar16);
      RVar4 = Eigen::internal::
              dot_nocheck<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>
              ::run((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&r,
                    (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(local_428 + uVar14 * -7)
                   );
      handles._0_8_ =
           (long)&ss[uVar14 * -7].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data + local_430;
      handles._24_8_ = *(double *)((long)alphas + lVar16) - dVar2 * RVar4;
      handles._8_8_ =
           *(undefined8 *)
            ((long)&ss[uVar14 * -7].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_data + local_438);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
                ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&r,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)handles);
      local_488 = local_488 + 8;
      local_428 = local_428 + 1;
      local_430 = local_430 + 0x10;
      local_438 = local_438 + 0x10;
    }
    local_400.container_ = (PolyConnectivity *)&r;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)handles,
               (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&local_400);
    dVar2 = getStepLength((Mesh *)x,(VectorXd *)error,(VectorXd *)handles,&gradx0,&epsilon,
                          *(double *)(&DAT_001a97c0 + (ulong)(__val == 0) * 8));
    free((void *)handles._0_8_);
    getEnergy((Mesh *)x,(VectorXd *)error,dVar3,true);
    poVar10 = std::operator<<((ostream *)std::cout,"Step: ");
    poVar10 = (ostream *)std::ostream::operator<<(poVar10,__val);
    std::operator<<(poVar10," Norm of Gradient: ");
    RVar6 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                      ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&gradx);
    poVar10 = std::ostream::_M_insert<double>(RVar6);
    std::endl<char,std::char_traits<char>>(poVar10);
    VVar7 = r;
    handles[2].super_BaseHandle.idx_ =
         (BaseHandle)
         (BaseHandle)
         r.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_;
    handles[3].super_BaseHandle.idx_ =
         (BaseHandle)
         (BaseHandle)
         r.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_;
    handles._32_8_ = &r;
    uVar11 = uVar11 % 7;
    pMVar17 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
              ((long)&ss[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                      .m_data + (ulong)(uint)((int)uVar11 << 4));
    handles._24_8_ = dVar2;
    r = VVar7;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)pMVar17,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)handles);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)error,pMVar17);
    calcGrad((Mesh *)handles,x,dVar3);
    pdVar1 = gradx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    gradx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)handles._0_8_;
    gradx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_ =
         handles[2].super_BaseHandle.idx_;
    gradx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
         handles[3].super_BaseHandle.idx_;
    free(pdVar1);
    handles._0_8_ = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&gradx;
    handles._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gradx0;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)(ys + uVar11),
               (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                *)handles);
    RVar4 = Eigen::internal::
            dot_nocheck<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_false>
            ::run(pMVar17,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(ys + uVar11));
    rhos[uVar11] = 1.0 / RVar4;
    free(r.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(gradx0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    free(q.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
    OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)&omesh);
    RVar6 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                      ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&gradx);
    pMVar8 = local_3f0;
    uVar11 = (ulong)(__val + 1);
  } while (*local_3e8 <= RVar6 && RVar6 != *local_3e8);
  *(double *)
   &(local_3f0->super_Mesh).
    super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
    .super_PolyConnectivity = *error;
  *(double *)
   &(local_3f0->super_Mesh).
    super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
    .super_PolyConnectivity.field_0x8 = error[1];
  *error = 0.0;
  error[1] = 0.0;
  free(gradx.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  lVar16 = 0x60;
  do {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::~DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)
               ((long)&ys[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data + lVar16));
    lVar16 = lVar16 + -0x10;
  } while (lVar16 != -0x10);
  lVar16 = 0x60;
  do {
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::~DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)
               ((long)&ss[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                       m_storage.m_data + lVar16));
    lVar16 = lVar16 + -0x10;
  } while (lVar16 != -0x10);
  tVar20.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  tVar20.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)pMVar8;
  return (type)tVar20.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

auto LBFGS(Mesh& mesh, Eigen::VectorXd x, const double& error) {
    static constexpr int sz = 7;
    auto test = [&error](const Eigen::VectorXd& x) -> bool {
        return x.norm() > error;
    };

    Eigen::VectorXd ss[sz], ys[sz];
    double rhos[sz], alphas[sz];
    double epsilon = getAveLen(mesh, x) * 0.25f;
    Eigen::VectorXd gradx = calcGrad(mesh, x, epsilon);
    int k = 0;
    int step = 0;
    do{
        // Write intermediate result if test mode is enabled
        #ifdef TEST
            Mesh omesh;
            for (int i = 0; i < x.size(); i += 2) {
                OpenMesh::Vec3f vert(x[i], x[i + 1], 0.0f);
                omesh.add_vertex(vert);
            }
            for (auto face: mesh.all_faces()) {
                int cnt = 0;
                OpenMesh::VertexHandle handles[10];
                for (auto v: mesh.fv_range(face)) 
                    handles[cnt++] = v;
                omesh.add_face(handles, cnt);
            }
            if(k % 10 == 0 || k == 1)
                OpenMesh::IO::write_mesh(omesh, std::to_string(k) + "test" + "_param" +  ".obj");
        #endif
        auto q = gradx;
        auto gradx0 = gradx;
        Eigen::VectorXd r(x.size());
        for (int i = k - 1; i >= std::max(0, k - sz); --i) {
            alphas[i % sz] = q.dot(ss[i % sz]) * rhos[i % sz];
            q -= alphas[i % sz] * ys[i % sz]; 
        }
        if (k == 0)
            r = q;
        else r = ss[(k - 1) % sz].dot(ys[(k - 1) % sz]) / ys[(k - 1) % sz].dot(ys[(k - 1) % sz]) * q;
        for (int i = std::max(0, k - sz); i < k; ++i) {
            auto beta = rhos[i % sz] * r.dot(ys[i %sz]);
            r += ss[i % sz] * (alphas[i % sz] - beta);
        }
        double step_len = getStepLength(mesh, x, -r, gradx0, epsilon, k == 0 ? 1e-5 : 1.0);
        auto energy = getEnergy(mesh, x, epsilon, true);
        #ifdef TEST
            std::cout << "Step: " << step++ << " Norm of Gradient: "<< gradx.norm() << std::endl;
        #endif
        // update array for y, s, rho
        ss[k % sz] = step_len * -r;
        x += ss[k % sz];
        gradx = calcGrad(mesh, x, epsilon);
        ys[k % sz] = gradx - gradx0;
        rhos[k % sz] = 1.0 / ss[k % sz].dot(ys[k % sz]);
       
        ++k;
    }while(test(gradx));

    return std::move(x);
}